

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O0

int nn_xsub_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_sockbase *local_40;
  size_t local_38;
  size_t sz;
  nn_fq_data *pnStack_28;
  int rcvprio;
  nn_xsub_data *data;
  nn_xsub *xsub;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_40 = self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_sockbase *)0x0;
  }
  data = (nn_xsub_data *)local_40;
  local_38 = 4;
  xsub = (nn_xsub *)pipe;
  pipe_local = (nn_pipe *)self;
  nn_pipe_getopt(pipe,0,9,(void *)((long)&sz + 4),&local_38);
  if (local_38 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
            ,0x74);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sz._4_4_ < 1 || 0x10 < sz._4_4_) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
            ,0x75);
    fflush(_stderr);
    nn_err_abort();
  }
  pnStack_28 = (nn_fq_data *)nn_alloc_(0x20);
  if (pnStack_28 == (nn_fq_data *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xsub.c"
            ,0x78);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_pipe_setdata((nn_pipe *)xsub,pnStack_28);
  nn_fq_add((nn_fq *)&(data->fq).priodata.item,pnStack_28,(nn_pipe *)xsub,sz._4_4_);
  return 0;
}

Assistant:

static int nn_xsub_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsub *xsub;
    struct nn_xsub_data *data;
    int rcvprio;
    size_t sz;

    xsub = nn_cont (self, struct nn_xsub, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xsub_data), "pipe data (sub)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_fq_add (&xsub->fq, &data->fq, pipe, rcvprio);

    return 0;
}